

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cc
# Opt level: O1

t_pvalue __thiscall
xemmai::t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_do_get
          (t_type_of<xemmai::t_type_of<xemmai::t_object>_> *this,t_object *a_this,t_object *a_key,
          size_t *a_index)

{
  t_object *ptVar1;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar2;
  ulong *in_R8;
  t_pvalue tVar3;
  
  ptVar1 = (t_object *)*in_R8;
  if (((ptVar1 < a_key[1].v_next) || (a_key[1].v_previous <= ptVar1)) ||
     (aVar2 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2)a_key,
     *(size_t **)(a_key[3].v_data + (long)ptVar1 * 0x18 + -8) != a_index)) {
    ptVar1 = (t_object *)
             t_type_of<xemmai::t_object>::f_index
                       ((t_type_of<xemmai::t_object> *)a_key->v_data,(t_object *)a_index);
    if ((ptVar1 < a_key[1].v_next) || (a_key[1].v_previous <= ptVar1)) {
      t_type_of<xemmai::t_object>::f_throw_undefined_field((t_object *)a_index);
    }
    *in_R8 = (ulong)ptVar1;
    aVar2 = extraout_RDX;
  }
  (this->
  super_t_uninstantiatable<xemmai::t_bears<xemmai::t_type_of<xemmai::t_object>,_xemmai::t_type_of<xemmai::t_object>_>_>
  ).super_t_bears<xemmai::t_type_of<xemmai::t_object>,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_derives<xemmai::t_type_of<xemmai::t_object>,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_type_of<xemmai::t_object>.v_this.v_p._M_b =
       (__pointer_type)*(__base_type *)(a_key[3].v_data + (long)ptVar1 * 0x18);
  (this->
  super_t_uninstantiatable<xemmai::t_bears<xemmai::t_type_of<xemmai::t_object>,_xemmai::t_type_of<xemmai::t_object>_>_>
  ).super_t_bears<xemmai::t_type_of<xemmai::t_object>,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_derives<xemmai::t_type_of<xemmai::t_object>,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_type_of<xemmai::t_object>.v_depth = *(size_t *)(a_key[3].v_data + (long)ptVar1 * 0x18 + 8)
  ;
  tVar3.field_0.v_integer = aVar2.v_integer;
  tVar3.super_t_pointer.v_p = (t_object *)this;
  return tVar3;
}

Assistant:

t_pvalue t_class::f_do_get(t_object* a_this, t_object* a_key, size_t& a_index)
{
	auto& type = a_this->f_as<t_type>();
	auto i = a_index;
	if (i < type.v_instance_fields || i >= type.v_fields || type.f_fields()[i].first != a_key) {
		i = type.f_index(a_key);
		if (i < type.v_instance_fields || i >= type.v_fields) f_throw_undefined_field(a_key);
		a_index = i;
	}
	return type.f_fields()[i].second;
}